

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
               (CodedInputStream *input,int *value)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t first_byte_or_zero;
  ulong uVar3;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar3 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_00fdefbe;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  if ((long)uVar3 < 0) {
    return false;
  }
LAB_00fdefbe:
  *value = (int)uVar3;
  return true;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
    io::CodedInputStream* input, int* value) {
  uint32_t temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = static_cast<int>(temp);
  return true;
}